

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O1

void __thiscall cppforth::Forth::readLine(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  pointer *ppcVar1;
  long *plVar2;
  pointer pcVar3;
  uint uVar4;
  uint uVar5;
  Cell *pCVar6;
  ulong uVar7;
  uint Value;
  ulong uVar8;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  vector<char,_std::allocator<char>_> readBuffer;
  allocator_type local_69;
  long *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  vector<char,_std::allocator<char>_> local_58;
  size_t local_38;
  
  requireDStackDepth(this,3,"READ-LINE");
  this_00 = &this->dStack;
  uVar4 = ForthStack<unsigned_int>::getTop(this_00);
  ppcVar1 = &local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)ppcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"READ-LINE","");
  GetFileHandle((Forth *)&local_68,(Cell)this,(string *)(ulong)uVar4,(errorCodes)&local_58);
  if ((pointer *)
      local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != ppcVar1) {
    operator_delete(local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1));
  }
  uVar4 = ForthStack<unsigned_int>::getTop(this_00,1);
  uVar5 = ForthStack<unsigned_int>::getTop(this_00,2);
  if (uVar4 == 0) {
    uVar4 = this->True;
    uVar5 = 0;
    Value = 0;
  }
  else {
    std::vector<char,_std::allocator<char>_>::vector(&local_58,(ulong)uVar4 + 2,&local_69);
    if (*(int *)((long)local_68 + *(long *)(*local_68 + -0x18) + 0x20) == 4) {
      std::ios::clear((int)local_68 + (int)*(long *)(*local_68 + -0x18));
    }
    std::ios::clear((int)local_68 + (int)*(undefined8 *)(*local_68 + -0x18));
    pcVar3 = local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    plVar2 = local_68;
    std::ios::widen((char)*(undefined8 *)(*local_68 + -0x18) + (char)local_68);
    std::istream::getline((char *)plVar2,(long)pcVar3,(char)uVar4 + '\x01');
    local_38 = strlen(local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    uVar7 = local_38 & 0xffffffff;
    if (uVar7 == uVar4) {
      if (*(int *)((long)local_68 + *(long *)(*local_68 + -0x18) + 0x20) == 4) {
        std::ios::clear((int)local_68 + (int)*(long *)(*local_68 + -0x18));
      }
    }
    pcVar3 = local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar7 != 0) {
      uVar8 = 0;
      do {
        dataSpaceSet(this,(int)uVar8 + uVar5,*(Char *)((long)pcVar3 + uVar8));
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
    }
    uVar5 = *(uint *)((long)local_68 + *(long *)(*local_68 + -0x18) + 0x20);
    pCVar6 = &this->False;
    if ((uVar5 & 2) == 0) {
      pCVar6 = &this->True;
    }
    Value = (uint)local_38;
    if (Value != 0) {
      pCVar6 = &this->True;
    }
    uVar4 = *pCVar6;
    if ((pointer *)
        local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer *)0x0) {
      operator_delete(local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar5 = -(uVar5 & 1) & 0xffffffb9;
  }
  ForthStack<unsigned_int>::setTop(this_00,0,uVar5);
  ForthStack<unsigned_int>::setTop(this_00,1,uVar4);
  ForthStack<unsigned_int>::setTop(this_00,2,Value);
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  return;
}

Assistant:

void readLine() {
	REQUIRE_DSTACK_DEPTH(3, "READ-LINE");
	auto h = (dStack.getTop()); 
	auto f = GetFileHandle(h, "READ-LINE", errorReadLine);
	auto length = SIZE_T(dStack.getTop(1));
	auto caddr = (dStack.getTop(2));
	Cell ior = 0;
	Cell flag = True;
	Cell u2 = 0;
	if (length > 0) {
		std::vector<char> readBuffer(length+2);
		if(f->rdstate() == std::ios::failbit) {
			f->clear(); // EOL is not read. Need to clear failbit flag and continue reading
		}
		f->clear();
		f->getline(&readBuffer[0], static_cast<std::streamsize>(length+1)); // add termination 0 to char counter
		auto realLength = static_cast<Cell>(std::strlen(&readBuffer[0]));
		if (realLength == (length ) && f->rdstate() == std::ios::failbit) {
			f->clear(); // EOL is not read. Need to clear failbit flag and continue reading
		}
		length = realLength;
		auto infoLength = f->gcount();
		moveIntoDataSpace(caddr, &readBuffer[0], length);
		u2 = static_cast<Cell>(length);
		if (f->rdstate() & std::ios::eofbit && u2==0) {
			flag = False; // EOF
		}
		else {
			flag = True;
		}
		ior = f->bad() ? Cell(errorReadLine) : 0;
	}
	
	dStack.setTop(0, ior);
	dStack.setTop(1, flag);
	dStack.setTop(2, u2);
}